

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

int main(void)

{
  test_location<void_(*)()> test;
  test_location<void_(*)()> test_00;
  test_location<void_(*)()> test_01;
  test_location<void_(*)()> test_02;
  test_location<void_(*)()> test_03;
  test_location<void_(*)()> test_04;
  test_location<void_(*)()> test_05;
  test_location<void_(*)()> test_06;
  test_location<void_(*)()> test_07;
  test_location<void_(*)()> test_08;
  test_location<void_(*)()> test_09;
  test_location<void_(*)()> test_10;
  test_location<void_(*)()> test_11;
  test_location<void_(*)()> test_12;
  test_location<void_(*)()> test_13;
  test local_1b0;
  code *local_178;
  char *pcStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  code *local_160;
  char *pcStack_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  code *local_148;
  char *pcStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  code *local_130;
  char *pcStack_128;
  undefined4 local_120;
  undefined4 uStack_11c;
  code *local_118;
  char *pcStack_110;
  undefined4 local_108;
  undefined4 uStack_104;
  code *local_100;
  char *pcStack_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  code *local_e8;
  char *pcStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  code *local_d0;
  char *pcStack_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  code *local_b8;
  char *pcStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  code *local_a0;
  char *pcStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  code *local_88;
  char *pcStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  code *local_70;
  char *pcStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  code *local_58;
  char *pcStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  code *local_40;
  char *pcStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  code *local_28;
  char *pcStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  
  local_28 = main::anon_class_1_0_00000001::__invoke;
  pcStack_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_18 = 0x2a;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"named objective",0xf);
  test.location._12_4_ = uStack_14;
  test.location.line_ = local_18;
  test.location.file_ = pcStack_20;
  test.test = local_28;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_40 = main::anon_class_1_0_00000001::__invoke;
  pcStack_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_30 = 0x3f;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"no-named objective",0x12);
  test_00.location._12_4_ = uStack_2c;
  test_00.location.line_ = local_30;
  test_00.location.file_ = pcStack_38;
  test_00.test = local_40;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_00);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_58 = main::anon_class_1_0_00000001::__invoke;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_48 = 0x52;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"small lp",8);
  test_01.location._12_4_ = uStack_44;
  test_01.location.line_ = local_48;
  test_01.location.file_ = pcStack_50;
  test_01.test = local_58;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_01);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_70 = main::anon_class_1_0_00000001::__invoke;
  pcStack_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_60 = 0x98;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic lp",0xc);
  test_02.location._12_4_ = uStack_5c;
  test_02.location.line_ = local_60;
  test_02.location.file_ = pcStack_68;
  test_02.test = local_70;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_02);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_88 = main::anon_class_1_0_00000001::__invoke;
  pcStack_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_78 = 0xe3;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic 2",0xb);
  test_03.location._12_4_ = uStack_74;
  test_03.location.line_ = local_78;
  test_03.location.file_ = pcStack_80;
  test_03.test = local_88;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_03);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_a0 = main::anon_class_1_0_00000001::__invoke;
  pcStack_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_90 = 0x138;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic 3",0xb);
  test_04.location._12_4_ = uStack_8c;
  test_04.location.line_ = local_90;
  test_04.location.file_ = pcStack_98;
  test_04.test = local_a0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_04);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_b8 = main::anon_class_1_0_00000001::__invoke;
  pcStack_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_a8 = 0x187;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic 4",0xb);
  test_05.location._12_4_ = uStack_a4;
  test_05.location.line_ = local_a8;
  test_05.location.file_ = pcStack_b0;
  test_05.test = local_b8;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_05);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_d0 = main::anon_class_1_0_00000001::__invoke;
  pcStack_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_c0 = 0x1d2;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic 5",0xb);
  test_06.location._12_4_ = uStack_bc;
  test_06.location.line_ = local_c0;
  test_06.location.file_ = pcStack_c8;
  test_06.test = local_d0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_06);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_e8 = main::anon_class_1_0_00000001::__invoke;
  pcStack_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_d8 = 0x227;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"quadratic 6",0xb);
  test_07.location._12_4_ = uStack_d4;
  test_07.location.line_ = local_d8;
  test_07.location.file_ = pcStack_e0;
  test_07.test = local_e8;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_07);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_100 = main::anon_class_1_0_00000001::__invoke;
  pcStack_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_f0 = 0x276;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"assignment_problem 0",0x14);
  test_08.location._12_4_ = uStack_ec;
  test_08.location.line_ = local_f0;
  test_08.location.file_ = pcStack_f8;
  test_08.test = local_100;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_08);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_118 = main::anon_class_1_0_00000001::__invoke;
  pcStack_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_108 = 0x295;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"geom-30a-3-ext_1000_support",0x1b);
  test_09.location._12_4_ = uStack_104;
  test_09.location.line_ = local_108;
  test_09.location.file_ = pcStack_110;
  test_09.test = local_118;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_09);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_130 = main::anon_class_1_0_00000001::__invoke;
  pcStack_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_120 = 0x2a6;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"general",7);
  test_10.location._12_4_ = uStack_11c;
  test_10.location.line_ = local_120;
  test_10.location.file_ = pcStack_128;
  test_10.test = local_130;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_10);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_148 = main::anon_class_1_0_00000001::__invoke;
  pcStack_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_138 = 0x2b6;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"sudoku",6);
  test_11.location._12_4_ = uStack_134;
  test_11.location.line_ = local_138;
  test_11.location.file_ = pcStack_140;
  test_11.test = local_148;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_11);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_160 = main::anon_class_1_0_00000001::__invoke;
  pcStack_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_150 = 0x2c4;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"8_queens_puzzle",0xf);
  test_12.location._12_4_ = uStack_14c;
  test_12.location.line_ = local_150;
  test_12.location.file_ = pcStack_158;
  test_12.test = local_160;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_12);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  local_178 = main::anon_class_1_0_00000001::__invoke;
  pcStack_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_168 = 0x2d3;
  boost::ext::ut::v1_1_8::literals::operator____test(&local_1b0,"vm",2);
  test_13.location._12_4_ = uStack_164;
  test_13.location.line_ = local_168;
  test_13.location.file_ = pcStack_170;
  test_13.test = local_178;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_13);
  std::
  _Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::~_Vector_base(&local_1b0.tag.
                   super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                 );
  return 0;
}

Assistant:

int
main()
{
    using namespace boost::ut;

    "named objective"_test = [] {
        const char* example = "maximize\n"
            "x0: +x1 + 2x2 + 3x3 - 100\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);
    };

    "no-named objective"_test = [] {
        const char* example = "maximize\n"
            "st: x1 + x2 + x3 = 1\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 0_ul);
        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 0_ul);
        expect(pb.greater_constraints.size() == 0_ul);
        expect(pb.equal_constraints.size() == 1_ul);
    };

    "small lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);

        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 3_ul);

        expect(pb.less_constraints[0].elements.size() == 3_ul);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[0].elements[1].factor == 1_i);
        expect(pb.less_constraints[0].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[0].elements[2].factor == 1_i);
        expect(pb.less_constraints[0].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[1].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[1].elements[1].factor == -3_i);
        expect(pb.less_constraints[1].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[1].elements[2].factor == 1_i);
        expect(pb.less_constraints[1].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[2].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[2].elements[1].factor == -3_i);
        expect(pb.less_constraints[2].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[2].elements[2].factor == 1_i);
        expect(pb.less_constraints[2].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0_i);
        expect(pb.vars.values[1].min == 0_i);
        expect(pb.vars.values[2].min == 0_i);

        expect(pb.vars.values[0].max == 40_i);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 2"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == 1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == 17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == -5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 3"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == 13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 4"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 5"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == -1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == -17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == 5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 6"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == -13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "assignment_problem 0"_test = [] {
        auto ctx = baryonyx::make_context(4);
        std::ifstream ifs;

        std::vector<std::vector<int>> values(3);

        values[0] = { 0, 0, 1, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 0, 1 };
        values[1] = { 0, 1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0 };
        values[2] = { 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 1, 0, 0, 0 };

        for (int i = 1; i != 4; ++i) {
            std::string filepath{ EXAMPLES_DIR "/assignment_problem_" };
            filepath += std::to_string(i);
            filepath += ".lp";

            auto pb = baryonyx::make_problem(ctx, filepath);

            expect(pb);
            expect(pb.status == baryonyx::file_format_error_tag::success);
            expect(pb.vars.names.size() == 16);
            expect(pb.vars.values.size() == 16);

            std::stringstream ss;
            ss << pb;

            auto pb2 = baryonyx::make_problem(*ctx, ss);

            expect(pb == pb2);
        }
    };

    "geom-30a-3-ext_1000_support"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(
          ctx, EXAMPLES_DIR "/geom-30a-3-ext_1000_support.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 819);
        expect(pb.vars.values.size() == 819);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::binary)
                ++nb;

        expect(nb == 90);
    };

    "general"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/general.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::general)
                ++nb;

        expect(nb == 3);
    };

    "sudoku"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/sudoku.lp");

        expect(pb.vars.names.size() == 81);
        expect(pb.vars.values.size() == 81);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 1);
            expect(vv.max == 9);
            expect(vv.type == baryonyx::variable_type::general);
        }
    };

    "8_queens_puzzle"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb =
          baryonyx::make_problem(ctx, EXAMPLES_DIR "/8_queens_puzzle.lp");

        expect(pb.vars.names.size() == 64);
        expect(pb.vars.values.size() == 64);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 0);
            expect(vv.max == 1);
            expect(vv.type == baryonyx::variable_type::binary);
        }
    };

    "vm"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/vm.lp");
    };
}